

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ComparisonTestTU<signed_char,unsigned_char>(void)

{
  if (ComparisonTestTU<signed_char,unsigned_char>()::b1 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  if (ComparisonTestTU<signed_char,unsigned_char>()::b2 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  if (ComparisonTestTU<signed_char,unsigned_char>()::b3 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  if (ComparisonTestTU<signed_char,unsigned_char>()::b4 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  if (ComparisonTestTU<signed_char,unsigned_char>()::b5 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  if (ComparisonTestTU<signed_char,unsigned_char>()::b6 == '\0') {
    ComparisonTestTU<signed_char,unsigned_char>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}